

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLSafe.cxx
# Opt level: O0

ostream * operator<<(ostream *os,cmXMLSafe *self)

{
  char *pcVar1;
  ostream *poVar2;
  char *pcVar3;
  char local_58 [8];
  char buf_1 [16];
  char buf [16];
  char *next;
  char *pcStack_28;
  uint ch;
  char *last;
  char *first;
  cmXMLSafe *self_local;
  ostream *os_local;
  
  pcStack_28 = self->Data + self->Size;
  last = self->Data;
  first = (char *)self;
  self_local = (cmXMLSafe *)os;
  while (last != pcStack_28) {
    pcVar1 = cm_utf8_decode_character(last,pcStack_28,(uint *)((long)&next + 4));
    if (pcVar1 == (char *)0x0) {
      next._4_4_ = (uint)(byte)*last;
      last = last + 1;
      sprintf(local_58,"%X",(ulong)next._4_4_);
      poVar2 = std::operator<<((ostream *)self_local,"[NON-UTF-8-BYTE-0x");
      poVar2 = std::operator<<(poVar2,local_58);
      std::operator<<(poVar2,"]");
    }
    else if ((((next._4_4_ < 0x20) || (0xd7ff < next._4_4_)) &&
             ((next._4_4_ < 0xe000 || (0xfffd < next._4_4_)))) &&
            ((((next._4_4_ < 0x10000 || (0x10ffff < next._4_4_)) && (next._4_4_ != 9)) &&
             ((next._4_4_ != 10 && (next._4_4_ != 0xd)))))) {
      sprintf(buf_1 + 8,"%X",(ulong)next._4_4_);
      poVar2 = std::operator<<((ostream *)self_local,"[NON-XML-CHAR-0x");
      poVar2 = std::operator<<(poVar2,buf_1 + 8);
      std::operator<<(poVar2,"]");
      last = pcVar1;
    }
    else {
      switch(next._4_4_) {
      case 0xd:
        last = pcVar1;
        break;
      default:
        std::ostream::write((char *)self_local,(long)last);
        last = pcVar1;
        break;
      case 0x22:
        pcVar3 = "\"";
        if ((first[0x10] & 1U) != 0) {
          pcVar3 = "&quot;";
        }
        std::operator<<((ostream *)self_local,pcVar3);
        last = pcVar1;
        break;
      case 0x26:
        std::operator<<((ostream *)self_local,"&amp;");
        last = pcVar1;
        break;
      case 0x27:
        pcVar3 = "\'";
        if ((first[0x10] & 1U) != 0) {
          pcVar3 = "&apos;";
        }
        std::operator<<((ostream *)self_local,pcVar3);
        last = pcVar1;
        break;
      case 0x3c:
        std::operator<<((ostream *)self_local,"&lt;");
        last = pcVar1;
        break;
      case 0x3e:
        std::operator<<((ostream *)self_local,"&gt;");
        last = pcVar1;
      }
    }
  }
  return (ostream *)self_local;
}

Assistant:

cmsys_ios::ostream& operator<<(cmsys_ios::ostream& os, cmXMLSafe const& self)
{
  char const* first = self.Data;
  char const* last = self.Data + self.Size;
  while(first != last)
    {
    unsigned int ch;
    if(const char* next = cm_utf8_decode_character(first, last, &ch))
      {
      // http://www.w3.org/TR/REC-xml/#NT-Char
      if((ch >= 0x20 && ch <= 0xD7FF) ||
         (ch >= 0xE000 && ch <= 0xFFFD) ||
         (ch >= 0x10000 && ch <= 0x10FFFF) ||
          ch == 0x9 || ch == 0xA || ch == 0xD)
        {
        switch(ch)
          {
          // Escape XML control characters.
          case '&': os << "&amp;"; break;
          case '<': os << "&lt;"; break;
          case '>': os << "&gt;"; break;
          case '"': os << (self.DoQuotes? "&quot;" : "\""); break;
          case '\'': os << (self.DoQuotes? "&apos;" : "'"); break;
          case '\r': break; // Ignore CR
          // Print the UTF-8 character.
          default: os.write(first, next-first); break;
          }
        }
      else
        {
        // Use a human-readable hex value for this invalid character.
        char buf[16];
        sprintf(buf, "%X", ch);
        os << "[NON-XML-CHAR-0x" << buf << "]";
        }

      first = next;
      }
    else
      {
      ch = static_cast<unsigned char>(*first++);
      // Use a human-readable hex value for this invalid byte.
      char buf[16];
      sprintf(buf, "%X", ch);
      os << "[NON-UTF-8-BYTE-0x" << buf << "]";
      }
    }
  return os;
}